

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::HandleEvent(Renderer *this,int status,int parm1,int parm2)

{
  uint uVar1;
  uint chan_00;
  int chan;
  int command;
  int parm2_local;
  int parm1_local;
  int status_local;
  Renderer *this_local;
  
  uVar1 = status & 0xf0;
  chan_00 = status & 0xf;
  if (uVar1 == 0x80) {
    note_off(this,chan_00,parm1,parm2);
  }
  else if (uVar1 == 0x90) {
    note_on(this,chan_00,parm1,parm2);
  }
  else if (uVar1 == 0xa0) {
    adjust_pressure(this,chan_00,parm1,parm2);
  }
  else if (uVar1 == 0xb0) {
    HandleController(this,chan_00,parm1,parm2);
  }
  else if (uVar1 == 0xc0) {
    if ((this->drumchannels & 1 << (sbyte)chan_00) == 0) {
      this->channel[(int)chan_00].program = parm1;
    }
    else {
      this->channel[(int)chan_00].bank = parm1;
    }
  }
  else if ((uVar1 != 0xd0) && (uVar1 == 0xe0)) {
    this->channel[(int)chan_00].pitchbend = parm1 | parm2 << 7;
    this->channel[(int)chan_00].pitchfactor = 0.0;
    adjust_pitchbend(this,chan_00);
  }
  return;
}

Assistant:

void Renderer::HandleEvent(int status, int parm1, int parm2)
{
	int command = status & 0xF0;
	int chan	= status & 0x0F;

	switch (command)
	{
	case ME_NOTEON:
		note_on(chan, parm1, parm2);
		break;

	case ME_NOTEOFF:
		note_off(chan, parm1, parm2);
		break;

	case ME_KEYPRESSURE:
		adjust_pressure(chan, parm1, parm2);
		break;

	case ME_CONTROLCHANGE:
		HandleController(chan, parm1, parm2);
		break;

	case ME_PROGRAM:
		if (ISDRUMCHANNEL(chan))
		{
			/* Change drum set */
			channel[chan].bank = parm1;
		}
		else
		{
			channel[chan].program = parm1;
		}
		break;

	case ME_CHANNELPRESSURE:
		/* Unimplemented */
		break;

	case ME_PITCHWHEEL:
		channel[chan].pitchbend = parm1 | (parm2 << 7);
		channel[chan].pitchfactor = 0;
		/* Adjust for notes already playing */
		adjust_pitchbend(chan);
		break;
	}
}